

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QPointer<QTextFrame>_>::reallocateAndGrow
          (QArrayDataPointer<QPointer<QTextFrame>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QPointer<QTextFrame>_> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  qsizetype qVar4;
  QObject *pQVar5;
  QPointer<QTextFrame> *pQVar6;
  QPointer<QTextFrame> *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QPointer<QTextFrame>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QPointer<QTextFrame>_> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar9 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,0x10,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4),
                        Grow);
    this->d = (Data *)auVar9._0_8_;
    this->ptr = (QPointer<QTextFrame> *)auVar9._8_8_;
  }
  else {
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QPointer<QTextFrame> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar8 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QPointer<QTextFrame>_> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        pQVar6 = this->ptr;
        pQVar7 = pQVar6 + lVar8;
        if ((lVar8 != 0) && (0 < lVar8)) {
          do {
            pDVar2 = (pQVar6->wp).d;
            local_38.ptr[local_38.size].wp.d = pDVar2;
            local_38.ptr[local_38.size].wp.value = (pQVar6->wp).value;
            if (pDVar2 != (Data *)0x0) {
              LOCK();
              (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
                   (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pQVar6 = pQVar6 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar6 < pQVar7);
        }
      }
      else {
        pQVar6 = this->ptr;
        pQVar7 = pQVar6 + lVar8;
        if ((lVar8 != 0) && (0 < lVar8)) {
          do {
            pQVar5 = (pQVar6->wp).value;
            local_38.ptr[local_38.size].wp.d = (pQVar6->wp).d;
            local_38.ptr[local_38.size].wp.value = pQVar5;
            (pQVar6->wp).d = (Data *)0x0;
            (pQVar6->wp).value = (QObject *)0x0;
            pQVar6 = pQVar6 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar6 < pQVar7);
        }
      }
    }
    pDVar3 = this->d;
    pQVar6 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    qVar4 = this->size;
    this->size = local_38.size;
    local_38.d = pDVar3;
    local_38.ptr = pQVar6;
    local_38.size = qVar4;
    if (old != (QArrayDataPointer<QPointer<QTextFrame>_> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = pQVar6;
      local_38.size = old->size;
      old->size = qVar4;
    }
    ~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }